

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_double_field_Test::TestBody
          (PriceUpdateDecoderTest_test_decode_double_field_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  AssertionResult gtest_ar;
  PriceField field;
  double value;
  string local_58 [32];
  FieldDef field_def;
  string local_30 [40];
  
  value = 34892343.2132;
  bidfx_public_api::tools::ByteBuffer::WriteDouble(34892343.2132);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"field",(allocator<char> *)&field);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(&field_def,1,0x44,local_58);
  std::__cxx11::string::~string(local_58);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&field,(FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_90.ptr_._0_4_ = 2;
  local_88.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&gtest_ar,"PriceField::DOUBLE","field.GetType()",(Type *)&local_90,
             (Type *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_90.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"value","field.GetDouble()",&value,(double *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::PriceField::~PriceField(&field);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_double_field)
{
    double value = 34892343.2132;
    buffer.WriteDouble(value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::DOUBLE, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::DOUBLE, field.GetType());
    EXPECT_EQ(value, field.GetDouble());
}